

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

void destroy_charmaps(FT_Face face,FT_Memory memory)

{
  FT_CharMap pFVar1;
  FT_Memory pFVar2;
  code *pcVar3;
  long lVar4;
  
  if (face != (FT_Face)0x0) {
    if (0 < face->num_charmaps) {
      lVar4 = 0;
      do {
        pFVar1 = face->charmaps[lVar4];
        pFVar2 = pFVar1->face->memory;
        pcVar3 = (code *)(pFVar1[1].face)->face_flags;
        if (pcVar3 != (code *)0x0) {
          (*pcVar3)(pFVar1);
        }
        (*pFVar2->free)(pFVar2,pFVar1);
        face->charmaps[lVar4] = (FT_CharMap)0x0;
        lVar4 = lVar4 + 1;
      } while (lVar4 < face->num_charmaps);
    }
    if (face->charmaps != (FT_CharMap *)0x0) {
      (*memory->free)(memory,face->charmaps);
    }
    face->charmaps = (FT_CharMap *)0x0;
    face->num_charmaps = 0;
  }
  return;
}

Assistant:

static void
  destroy_charmaps( FT_Face    face,
                    FT_Memory  memory )
  {
    FT_Int  n;


    if ( !face )
      return;

    for ( n = 0; n < face->num_charmaps; n++ )
    {
      FT_CMap  cmap = FT_CMAP( face->charmaps[n] );


      ft_cmap_done_internal( cmap );

      face->charmaps[n] = NULL;
    }

    FT_FREE( face->charmaps );
    face->num_charmaps = 0;
  }